

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O3

int log_add_fp(FILE *fp,int level)

{
  Callback *pCVar1;
  int iVar2;
  Callback *pCVar3;
  Callback *pCVar4;
  ulong uVar5;
  
  if (L.callbacks[0].fn == (log_LogFn)0x0) {
    pCVar4 = L.callbacks;
    iVar2 = 0;
  }
  else {
    uVar5 = 0xffffffffffffffff;
    pCVar3 = L.callbacks;
    do {
      if (uVar5 == 0x1e) {
        return -1;
      }
      pCVar4 = pCVar3 + 1;
      uVar5 = uVar5 + 1;
      pCVar1 = pCVar3 + 1;
      pCVar3 = pCVar4;
    } while (pCVar1->fn != (log_LogFn)0x0);
    iVar2 = (uVar5 < 0x1f) - 1;
  }
  pCVar4->fn = file_callback;
  pCVar4->udata = fp;
  pCVar4->level = level;
  return iVar2;
}

Assistant:

int log_add_callback(log_LogFn fn, void *udata, int level) {
    for (int i = 0; i < MAX_CALLBACKS; i++) {
        if (!L.callbacks[i].fn) {
            L.callbacks[i] = (Callback){fn, udata, level};
            return 0;
        }
    }
    return -1;
}